

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_generator.cc
# Opt level: O1

string * google::protobuf::compiler::javanano::anon_unknown_4::TrimString
                   (string *__return_storage_ptr__,string *s)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)s,0x357dfb,0);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::find_last_not_of((char *)s,0x357dfb,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  return __return_storage_ptr__;
}

Assistant:

string TrimString(const string& s) {
  string::size_type start = s.find_first_not_of(" \n\r\t");
  if (start == string::npos) {
    return "";
  }
  string::size_type end = s.find_last_not_of(" \n\r\t") + 1;
  return s.substr(start, end - start);
}